

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O2

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint flag;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  secp256k1_ge *psVar10;
  uint64_t uVar11;
  secp256k1_ge *psVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong in_R11;
  int iVar16;
  bool bVar17;
  byte bVar18;
  ulong local_a70;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_ge_storage a2_stor;
  secp256k1_ge_storage correction_1_stor;
  int wnaf_1 [65];
  secp256k1_ge correction;
  secp256k1_ge pre_a [8];
  secp256k1_scalar neg_s;
  
  bVar18 = 0;
  pre_a[0].x.n[0] = scalar->d[0];
  pre_a[0].x.n[1] = scalar->d[1];
  pre_a[0].x.n[2] = scalar->d[2];
  pre_a[0].x.n[3] = scalar->d[3];
  flag = secp256k1_scalar_is_high((secp256k1_scalar *)pre_a);
  uVar11 = pre_a[0].x.n[0];
  uVar7 = (uint)pre_a[0].x.n[0] & 1;
  secp256k1_scalar_negate(&neg_s,(secp256k1_scalar *)pre_a);
  uVar5 = (ulong)((((neg_s.d[0] ^ 1) != 0 || neg_s.d[1] != 0) || neg_s.d[2] != 0) || neg_s.d[3] != 0
                 ) << (((byte)uVar7 ^ (byte)flag) & 0x3f);
  pre_a[0].x.n[0] = uVar5 + uVar11;
  uVar5 = (ulong)CARRY8(uVar5,uVar11);
  bVar17 = CARRY8(pre_a[0].x.n[1],uVar5);
  pre_a[0].x.n[1] = pre_a[0].x.n[1] + uVar5;
  uVar5 = (ulong)bVar17;
  bVar17 = CARRY8(pre_a[0].x.n[2],uVar5);
  pre_a[0].x.n[2] = pre_a[0].x.n[2] + uVar5;
  pre_a[0].x.n[3] = pre_a[0].x.n[3] + bVar17;
  iVar3 = secp256k1_scalar_cond_negate((secp256k1_scalar *)pre_a,flag);
  iVar16 = -iVar3;
  if ((((neg_s.d[0] ^ 1) != 0 || neg_s.d[1] != 0) || neg_s.d[2] != 0) || neg_s.d[3] != 0) {
    iVar16 = iVar3;
  }
  uVar5 = pre_a[0].x.n[0] >> 4 | pre_a[0].x.n[1] << 0x3c;
  uVar6 = pre_a[0].x.n[1] >> 4 | pre_a[0].x.n[2] << 0x3c;
  uVar9 = pre_a[0].x.n[2] >> 4 | pre_a[0].x.n[3] << 0x3c;
  uVar11 = pre_a[0].x.n[3];
  uVar14 = (uint)pre_a[0].x.n[0] & 0xf;
  for (lVar13 = 0; lVar13 < size; lVar13 = lVar13 + 4) {
    uVar11 = uVar11 >> 4;
    uVar15 = (uint)uVar5;
    uVar5 = uVar5 >> 4 | uVar6 << 0x3c;
    uVar6 = uVar6 >> 4 | uVar9 << 0x3c;
    uVar9 = uVar9 >> 4 | uVar11 << 0x3c;
    uVar8 = ~uVar15 & 1;
    uVar4 = -uVar8;
    if (0 < (int)uVar14) {
      uVar4 = uVar8;
    }
    uVar15 = (uVar15 & 0xf) + uVar4;
    in_R11 = (ulong)uVar15;
    *(uint *)((long)wnaf_1 + lVar13) = (uVar14 + uVar4 * -0x10) * iVar16;
    uVar14 = uVar15;
  }
  *(int *)((long)wnaf_1 + lVar13) = (int)in_R11 * iVar16;
  r->infinity = a->infinity;
  uVar11 = (a->x).n[1];
  uVar1 = (a->x).n[2];
  uVar2 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar11;
  (r->x).n[2] = uVar1;
  (r->x).n[3] = uVar2;
  (r->x).n[4] = (a->x).n[4];
  uVar11 = (a->y).n[1];
  uVar1 = (a->y).n[2];
  uVar2 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar11;
  (r->y).n[2] = uVar1;
  (r->y).n[3] = uVar2;
  (r->y).n[4] = (a->y).n[4];
  (r->z).n[0] = 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  secp256k1_ecmult_odd_multiples_table
            ((int)(secp256k1_gej *)&neg_s,(secp256k1_gej *)&tmpa,&r->x,(secp256k1_gej *)a);
  secp256k1_ge_globalz_set_table_gej(8,pre_a,&Z,(secp256k1_gej *)&neg_s,(secp256k1_fe *)&tmpa);
  for (lVar13 = 0x28; lVar13 != 0x2e8; lVar13 = lVar13 + 0x58) {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)pre_a[0].x.n + lVar13));
  }
  local_a70 = (ulong)(size + 3U >> 2);
  uVar14 = *(uint *)((long)wnaf_1 + (ulong)(size + 3U & 0xfffffffc));
  uVar4 = -uVar14;
  if (uVar14 != uVar4 && SBORROW4(uVar14,uVar4) == (int)(uVar14 * 2) < 0) {
    uVar4 = uVar14;
  }
  for (lVar13 = 0; lVar13 != 0x2c0; lVar13 = lVar13 + 0x58) {
    uVar15 = (uint)((ulong)(uVar4 >> 1) * 0x58 - lVar13 == 0);
    secp256k1_fe_cmov(&tmpa.x,(secp256k1_fe *)((long)pre_a[0].x.n + lVar13),uVar15);
    secp256k1_fe_cmov(&tmpa.y,(secp256k1_fe *)((long)pre_a[0].y.n + lVar13),uVar15);
  }
  tmpa.infinity = 0;
  neg_s.d[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
  neg_s.d[1] = 0x3ffffffffffffc - tmpa.y.n[1];
  neg_s.d[2] = 0x3ffffffffffffc - tmpa.y.n[2];
  neg_s.d[3] = 0x3ffffffffffffc - tmpa.y.n[3];
  secp256k1_fe_cmov(&tmpa.y,(secp256k1_fe *)&neg_s,uVar14 >> 0x1f);
  r->infinity = tmpa.infinity;
  (r->x).n[4] = tmpa.x.n[4];
  (r->x).n[2] = tmpa.x.n[2];
  (r->x).n[3] = tmpa.x.n[3];
  (r->x).n[0] = tmpa.x.n[0];
  (r->x).n[1] = tmpa.x.n[1];
  (r->y).n[0] = tmpa.y.n[0];
  (r->y).n[1] = tmpa.y.n[1];
  (r->y).n[2] = tmpa.y.n[2];
  (r->y).n[3] = tmpa.y.n[3];
  (r->y).n[4] = tmpa.y.n[4];
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  while (0 < (long)local_a70) {
    local_a70 = local_a70 - 1;
    iVar16 = 4;
    while (bVar17 = iVar16 != 0, iVar16 = iVar16 + -1, bVar17) {
      secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    }
    uVar14 = wnaf_1[local_a70];
    uVar4 = -uVar14;
    if (uVar14 != uVar4 && SBORROW4(uVar14,uVar4) == (int)(uVar14 * 2) < 0) {
      uVar4 = uVar14;
    }
    psVar10 = pre_a;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      uVar15 = (uint)(uVar4 >> 1 == uVar5);
      secp256k1_fe_cmov(&tmpa.x,&psVar10->x,uVar15);
      secp256k1_fe_cmov(&tmpa.y,&psVar10->y,uVar15);
      psVar10 = psVar10 + 1;
    }
    tmpa.infinity = 0;
    neg_s.d[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
    neg_s.d[1] = 0x3ffffffffffffc - tmpa.y.n[1];
    neg_s.d[2] = 0x3ffffffffffffc - tmpa.y.n[2];
    neg_s.d[3] = 0x3ffffffffffffc - tmpa.y.n[3];
    secp256k1_fe_cmov(&tmpa.y,(secp256k1_fe *)&neg_s,uVar14 >> 0x1f);
    secp256k1_gej_add_ge(r,r,&tmpa);
  }
  secp256k1_fe_mul(&r->z,&r->z,&Z);
  psVar10 = a;
  psVar12 = &correction;
  for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
    (psVar12->x).n[0] = (psVar10->x).n[0];
    psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar18 * -0x10 + 8);
    psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar18 * -0x10 + 8);
  }
  neg_s.d[0] = (a->x).n[0];
  neg_s.d[1] = (a->x).n[1];
  neg_s.d[2] = (a->x).n[2];
  neg_s.d[3] = (a->x).n[3];
  secp256k1_gej_double_var((secp256k1_gej *)&neg_s,(secp256k1_gej *)&neg_s,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej(&correction,(secp256k1_gej *)&neg_s);
  secp256k1_ge_to_storage(&correction_1_stor,a);
  secp256k1_ge_to_storage(&a2_stor,&correction);
  secp256k1_ge_storage_cmov(&correction_1_stor,&a2_stor,(uint)(uVar7 != flag));
  secp256k1_ge_from_storage(&correction,&correction_1_stor);
  secp256k1_ge_neg(&correction,&correction);
  secp256k1_gej_add_ge(r,r,&correction);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
#endif
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;
    secp256k1_scalar sc = *scalar;

    /* build wnaf representation for q. */
    int rsize = size;
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, &sc);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, q_lam, WINDOW_A - 1, 128);
    } else
#endif
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, sc, WINDOW_A - 1, size);
#ifdef USE_ENDOMORPHISM
        skew_lam = 0;
#endif
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }
    }
#endif

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
#endif
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double_nonzero(r, r, NULL);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
#endif
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);

    {
        /* Correct for wNAF skew */
        secp256k1_ge correction = *a;
        secp256k1_ge_storage correction_1_stor;
#ifdef USE_ENDOMORPHISM
        secp256k1_ge_storage correction_lam_stor;
#endif
        secp256k1_ge_storage a2_stor;
        secp256k1_gej tmpj;
        secp256k1_gej_set_ge(&tmpj, &correction);
        secp256k1_gej_double_var(&tmpj, &tmpj, NULL);
        secp256k1_ge_set_gej(&correction, &tmpj);
        secp256k1_ge_to_storage(&correction_1_stor, a);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_to_storage(&correction_lam_stor, a);
        }
#endif
        secp256k1_ge_to_storage(&a2_stor, &correction);

        /* For odd numbers this is 2a (so replace it), for even ones a (so no-op) */
        secp256k1_ge_storage_cmov(&correction_1_stor, &a2_stor, skew_1 == 2);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_storage_cmov(&correction_lam_stor, &a2_stor, skew_lam == 2);
        }
#endif

        /* Apply the correction */
        secp256k1_ge_from_storage(&correction, &correction_1_stor);
        secp256k1_ge_neg(&correction, &correction);
        secp256k1_gej_add_ge(r, r, &correction);

#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_from_storage(&correction, &correction_lam_stor);
            secp256k1_ge_neg(&correction, &correction);
            secp256k1_ge_mul_lambda(&correction, &correction);
            secp256k1_gej_add_ge(r, r, &correction);
        }
#endif
    }
}